

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void fill_inverse_cmap(j_decompress_ptr cinfo,int c0,int c1,int c2)

{
  _func_void_j_decompress_ptr *p_Var1;
  int minc0_00;
  int minc1_00;
  int minc2_00;
  int numcolors_00;
  histcell local_1e8 [4];
  JSAMPLE bestcolor [128];
  JSAMPLE local_158 [4];
  int numcolors;
  JSAMPLE colorlist [256];
  histptr cachep;
  JSAMPLE *cptr;
  int ic2;
  int ic1;
  int ic0;
  int minc2;
  int minc1;
  int minc0;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  int c2_local;
  int c1_local;
  int c0_local;
  j_decompress_ptr cinfo_local;
  
  p_Var1 = cinfo->cquantize[1].finish_pass;
  minc0_00 = (c0 >> 2) * 0x20 + 4;
  minc1_00 = (c1 >> 3) * 0x20 + 2;
  minc2_00 = (c2 >> 2) * 0x20 + 4;
  numcolors_00 = find_nearby_colors(cinfo,minc0_00,minc1_00,minc2_00,local_158);
  find_best_colors(cinfo,minc0_00,minc1_00,minc2_00,numcolors_00,local_158,(JSAMPLE *)local_1e8);
  cachep = local_1e8;
  for (ic2 = 0; ic2 < 4; ic2 = ic2 + 1) {
    for (cptr._4_4_ = 0; cptr._4_4_ < 8; cptr._4_4_ = cptr._4_4_ + 1) {
      colorlist._248_8_ =
           *(long *)(p_Var1 + (long)((c0 >> 2) * 4 + ic2) * 8) +
           (long)((c1 >> 3) * 8 + cptr._4_4_) * 0x40 + (long)((c2 >> 2) << 2) * 2;
      for (cptr._0_4_ = 0; (int)cptr < 4; cptr._0_4_ = (int)cptr + 1) {
        *(ushort *)colorlist._248_8_ = (byte)*cachep + 1;
        colorlist._248_8_ = colorlist._248_8_ + 2;
        cachep = (histptr)((long)cachep + 1);
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
fill_inverse_cmap (j_decompress_ptr cinfo, int c0, int c1, int c2)
/* Fill the inverse-colormap entries in the update box that contains */
/* histogram cell c0/c1/c2.  (Only that one cell MUST be filled, but */
/* we can fill as many others as we wish.) */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  int minc0, minc1, minc2;	/* lower left corner of update box */
  int ic0, ic1, ic2;
  register JSAMPLE * cptr;	/* pointer into bestcolor[] array */
  register histptr cachep;	/* pointer into main cache array */
  /* This array lists the candidate colormap indexes. */
  JSAMPLE colorlist[MAXNUMCOLORS];
  int numcolors;		/* number of candidate colors */
  /* This array holds the actually closest colormap index for each cell. */
  JSAMPLE bestcolor[BOX_C0_ELEMS * BOX_C1_ELEMS * BOX_C2_ELEMS];

  /* Convert cell coordinates to update box ID */
  c0 >>= BOX_C0_LOG;
  c1 >>= BOX_C1_LOG;
  c2 >>= BOX_C2_LOG;

  /* Compute true coordinates of update box's origin corner.
   * Actually we compute the coordinates of the center of the corner
   * histogram cell, which are the lower bounds of the volume we care about.
   */
  minc0 = (c0 << BOX_C0_SHIFT) + ((1 << C0_SHIFT) >> 1);
  minc1 = (c1 << BOX_C1_SHIFT) + ((1 << C1_SHIFT) >> 1);
  minc2 = (c2 << BOX_C2_SHIFT) + ((1 << C2_SHIFT) >> 1);
  
  /* Determine which colormap entries are close enough to be candidates
   * for the nearest entry to some cell in the update box.
   */
  numcolors = find_nearby_colors(cinfo, minc0, minc1, minc2, colorlist);

  /* Determine the actually nearest colors. */
  find_best_colors(cinfo, minc0, minc1, minc2, numcolors, colorlist,
		   bestcolor);

  /* Save the best color numbers (plus 1) in the main cache array */
  c0 <<= BOX_C0_LOG;		/* convert ID back to base cell indexes */
  c1 <<= BOX_C1_LOG;
  c2 <<= BOX_C2_LOG;
  cptr = bestcolor;
  for (ic0 = 0; ic0 < BOX_C0_ELEMS; ic0++) {
    for (ic1 = 0; ic1 < BOX_C1_ELEMS; ic1++) {
      cachep = & histogram[c0+ic0][c1+ic1][c2];
      for (ic2 = 0; ic2 < BOX_C2_ELEMS; ic2++) {
	*cachep++ = (histcell) (GETJSAMPLE(*cptr++) + 1);
      }
    }
  }
}